

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls_wrapper.cpp
# Opt level: O0

mbedtls_sha256_context * __thiscall
duckdb_mbedtls::MbedTlsWrapper::SHA256State::Finalize_abi_cxx11_(SHA256State *this)

{
  int iVar1;
  runtime_error *this_00;
  mbedtls_sha256_context *in_RDI;
  mbedtls_sha256_context *context;
  string *hash;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  mbedtls_sha256_context *ctx;
  
  ctx = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  std::__cxx11::string::resize((ulong)in_RDI);
  std::__cxx11::string::data();
  iVar1 = mbedtls_sha256_finish
                    (ctx,(uchar *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (iVar1 == 0) {
    return ctx;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"SHA256 Error");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string MbedTlsWrapper::SHA256State::Finalize() {
	auto context = reinterpret_cast<mbedtls_sha256_context *>(sha_context);

	string hash;
	hash.resize(MbedTlsWrapper::SHA256_HASH_LENGTH_BYTES);

	if (mbedtls_sha256_finish(context, (unsigned char *)hash.data())) {
		throw std::runtime_error("SHA256 Error");
	}

	return hash;
}